

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O1

void gba_system_loop(void)

{
  arm7tdmi_t *paVar1;
  gba_apu_t *pgVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int line;
  int iVar6;
  gba_ppu_t *ctx;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  if (!should_quit) {
    iVar6 = 0;
    iVar3 = 0;
    do {
      do {
        iVar8 = iVar3 + 0x3c0;
        iVar7 = iVar8;
        if (-0x3c0 < iVar3) {
          do {
            paVar1 = cpu;
            cpu_stepped = false;
            bVar9 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
            cpu->irq = bVar9;
            iVar3 = 1;
            if ((~paVar1->halt & 1U) != 0 || bVar9) {
              cpu_stepped = true;
              iVar3 = arm7tdmi_step(paVar1);
            }
            timer_tick(iVar3);
            iVar8 = iVar3;
            if (0 < iVar3) {
              do {
                pgVar2 = apu;
                uVar4 = apu->apu_cycle_counter + 1;
                apu->apu_cycle_counter = uVar4;
                if (0x15d < uVar4) {
                  pgVar2->apu_cycle_counter = 0;
                  apu_push_sample(pgVar2);
                }
                iVar8 = iVar8 + -1;
              } while (iVar8 != 0);
            }
            iVar8 = iVar7 - iVar3;
            bVar9 = iVar3 <= iVar7;
            iVar7 = iVar8;
          } while (iVar8 != 0 && bVar9);
        }
        ppu_hblank(ppu);
        iVar3 = iVar8 + 0x110;
        iVar7 = iVar3;
        if (-0x110 < iVar8) {
          do {
            paVar1 = cpu;
            cpu_stepped = false;
            bVar9 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
            cpu->irq = bVar9;
            iVar8 = 1;
            if ((~paVar1->halt & 1U) != 0 || bVar9) {
              cpu_stepped = true;
              iVar8 = arm7tdmi_step(paVar1);
            }
            timer_tick(iVar8);
            iVar3 = iVar8;
            if (0 < iVar8) {
              do {
                pgVar2 = apu;
                uVar4 = apu->apu_cycle_counter + 1;
                apu->apu_cycle_counter = uVar4;
                if (0x15d < uVar4) {
                  pgVar2->apu_cycle_counter = 0;
                  apu_push_sample(pgVar2);
                }
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
            }
            iVar3 = iVar7 - iVar8;
            bVar9 = iVar8 <= iVar7;
            iVar7 = iVar3;
          } while (iVar3 != 0 && bVar9);
        }
        ppu_end_hblank(ppu);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0xa0);
      ppu_vblank(ppu);
      iVar6 = 0;
      do {
        iVar7 = iVar3 + 0x3c0;
        iVar8 = iVar7;
        if (-0x3c0 < iVar3) {
          do {
            paVar1 = cpu;
            cpu_stepped = false;
            bVar9 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
            cpu->irq = bVar9;
            iVar3 = 1;
            if ((~paVar1->halt & 1U) != 0 || bVar9) {
              cpu_stepped = true;
              iVar3 = arm7tdmi_step(paVar1);
            }
            timer_tick(iVar3);
            iVar7 = iVar3;
            if (0 < iVar3) {
              do {
                pgVar2 = apu;
                uVar4 = apu->apu_cycle_counter + 1;
                apu->apu_cycle_counter = uVar4;
                if (0x15d < uVar4) {
                  pgVar2->apu_cycle_counter = 0;
                  apu_push_sample(pgVar2);
                }
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            iVar7 = iVar8 - iVar3;
            bVar9 = iVar3 <= iVar8;
            iVar8 = iVar7;
          } while (iVar7 != 0 && bVar9);
        }
        ppu_hblank(ppu);
        iVar3 = iVar7 + 0x110;
        iVar8 = iVar3;
        if (-0x110 < iVar7) {
          do {
            paVar1 = cpu;
            cpu_stepped = false;
            bVar9 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
            cpu->irq = bVar9;
            iVar7 = 1;
            if ((~paVar1->halt & 1U) != 0 || bVar9) {
              cpu_stepped = true;
              iVar7 = arm7tdmi_step(paVar1);
            }
            timer_tick(iVar7);
            iVar3 = iVar7;
            if (0 < iVar7) {
              do {
                pgVar2 = apu;
                uVar4 = apu->apu_cycle_counter + 1;
                apu->apu_cycle_counter = uVar4;
                if (0x15d < uVar4) {
                  pgVar2->apu_cycle_counter = 0;
                  apu_push_sample(pgVar2);
                }
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
            }
            iVar3 = iVar8 - iVar7;
            bVar9 = iVar7 <= iVar8;
            iVar8 = iVar3;
          } while (iVar3 != 0 && bVar9);
        }
        ppu_end_hblank(ppu);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0x44);
      ctx = ppu;
      ppu_end_vblank(ppu);
      persist_backup();
      iVar6 = 0;
    } while (should_quit == false);
    cleanup((EVP_PKEY_CTX *)ctx);
    return;
  }
  free(mem->backup);
  free(mem->backup_path);
  lVar5 = 0;
  do {
    free(mem->savestate_path[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  free(mem->savestate_path);
  free(mem->rom);
  free(mem);
  mem = (gbamem_t *)0x0;
  free(ppu);
  ppu = (gba_ppu_t *)0x0;
  free(bus);
  bus = (gbabus_t *)0x0;
  free(apu);
  apu = (gba_apu_t *)0x0;
  free(cpu);
  cpu = (arm7tdmi_t *)0x0;
  return;
}

Assistant:

void gba_system_loop() {
    int extra = 0;
    while (!should_quit) {
        for (int line = 0; line < VISIBLE_LINES; line++) {
            extra = run_system(VISIBLE_CYCLES + extra);
            ppu_hblank(ppu);
            extra = run_system(HBLANK_CYCLES + extra);
            ppu_end_hblank(ppu);
        }
        ppu_vblank(ppu);
        for (int line = 0; line < VBLANK_LINES; line++) {
            extra = run_system(VISIBLE_CYCLES + extra);
            ppu_hblank(ppu);
            extra = run_system(HBLANK_CYCLES + extra);
            ppu_end_hblank(ppu);
        }
        ppu_end_vblank(ppu);
        persist_backup();
    }

    cleanup();
}